

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcipher.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,QSslCipher *cipher)

{
  QDebug *pQVar1;
  QString *t;
  char *in_RDX;
  QDebug *in_RSI;
  Stream *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  QDebug *in_stack_ffffffffffffff70;
  QDebug *in_stack_ffffffffffffff78;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,in_RSI);
  pQVar1 = (QDebug *)QDebug::resetFormat();
  pQVar1 = QDebug::nospace(pQVar1);
  QDebug::noquote(pQVar1);
  t = (QString *)QDebug::operator<<(in_stack_ffffffffffffff78,in_RDX);
  QSslCipher::name((QSslCipher *)t);
  QDebug::operator<<(in_stack_ffffffffffffff70,t);
  pQVar1 = QDebug::operator<<(in_stack_ffffffffffffff78,in_RDX);
  QSslCipher::usedBits((QSslCipher *)0x38c115);
  QDebug::operator<<((QDebug *)in_RDI,in_stack_ffffffffffffff5c);
  QDebug::operator<<(in_stack_ffffffffffffff78,in_RDX);
  QSslCipher::protocolString((QSslCipher *)t);
  QDebug::operator<<(pQVar1,t);
  QDebug::operator<<((QDebug *)in_RDI,(char)((uint)in_stack_ffffffffffffff5c >> 0x18));
  QString::~QString((QString *)0x38c16f);
  QString::~QString((QString *)0x38c179);
  QDebug::QDebug((QDebug *)in_RDI,
                 (QDebug *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QSslCipher &cipher)
{
    QDebugStateSaver saver(debug);
    debug.resetFormat().nospace().noquote();
    debug << "QSslCipher(name=" << cipher.name()
          << ", bits=" << cipher.usedBits()
          << ", proto=" << cipher.protocolString()
          << ')';
    return debug;
}